

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

bool __thiscall
Jinx::Impl::Parser::CheckFunctionSignature
          (Parser *this,SymbolListCItr currSym,FunctionSignature *signature,size_t *symCount)

{
  pointer pFVar1;
  Symbol *pSVar2;
  pointer pbVar3;
  long lVar4;
  SymbolType SVar5;
  int iVar6;
  ulong uVar7;
  Symbol *pSVar8;
  long lVar9;
  pointer pFVar10;
  pointer this_00;
  
  if (symCount != (size_t *)0x0) {
    *symCount = 0;
  }
  pFVar10 = (signature->m_parts).
            super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pFVar1 = (signature->m_parts).
           super__Vector_base<Jinx::Impl::FunctionSignaturePart,_Jinx::StaticAllocator<Jinx::Impl::FunctionSignaturePart,_1024UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar10 == pFVar1) {
    lVar9 = 0;
  }
  else {
    lVar9 = 0;
    do {
      if (this->m_error != false) {
        return false;
      }
      pSVar2 = (this->m_symbolList->
               super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl
               .super__Vector_impl_data._M_finish;
      if (pSVar2 == currSym._M_current) {
        return false;
      }
      if ((currSym._M_current)->type == NewLine) {
        return false;
      }
      if (pFVar10->partType == Parameter) {
        if (((currSym._M_current)->type != CurlyOpen) ||
           (pSVar8 = currSym._M_current + 1, pSVar2 == pSVar8)) {
          return false;
        }
        SVar5 = pSVar8->type;
        uVar7 = (ulong)SVar5;
        lVar4 = lVar9 + 1;
        if (uVar7 < 0x3f) {
          if ((0x40308c0c80000000U >> (uVar7 & 0x3f) & 1) == 0) {
            if (uVar7 == 2) {
              return false;
            }
          }
          else {
            pSVar8 = currSym._M_current + 2;
            if (pSVar2 == pSVar8) {
              return false;
            }
            SVar5 = pSVar8->type;
            if (SVar5 == NewLine) {
              return false;
            }
            lVar4 = lVar9 + 2;
          }
        }
        lVar9 = lVar4;
        currSym._M_current = pSVar8;
        if (SVar5 != CurlyClose) {
          return false;
        }
      }
      else {
        this_00 = (pFVar10->names).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar3 = (pFVar10->names).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_Jinx::StaticAllocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>,_128UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (this_00 != pbVar3) {
          do {
            iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>
                    ::compare(this_00,&(currSym._M_current)->text);
            if (iVar6 == 0) goto LAB_001219c9;
            this_00 = this_00 + 1;
          } while (this_00 != pbVar3);
        }
        if (pFVar10->optional != true) {
          return false;
        }
      }
LAB_001219c9:
      currSym._M_current = currSym._M_current + 1;
      lVar9 = lVar9 + 1;
      pFVar10 = pFVar10 + 1;
    } while (pFVar10 != pFVar1);
  }
  if (symCount != (size_t *)0x0) {
    *symCount = *symCount + lVar9;
  }
  return true;
}

Assistant:

inline_t bool Parser::CheckFunctionSignature(SymbolListCItr currSym, const FunctionSignature & signature, size_t * symCount) const
	{
		size_t count = 0;
		if (symCount)
			*symCount = 0;
		for (const auto & part : signature.GetParts())
		{
			if (!IsSymbolValid(currSym))
				return false;
			if (part.partType == FunctionSignaturePartType::Parameter)
			{
				if (currSym->type != SymbolType::CurlyOpen)
					return false;
				++currSym;
				++count;
				if (!IsSymbolValid(currSym))
					return false;
				if (CheckValueType(currSym))
				{
					++currSym;
					++count;
					if (!IsSymbolValid(currSym))
						return false;
				}
				if (currSym->type != SymbolType::CurlyClose)
					return false;
			}
			else
			{
				bool matched = false;
				for (const auto & name : part.names)
				{
					if (name == currSym->text)
					{
						matched = true;
						break;
					}
				}
				if (!matched && !part.optional)
					return false;
			}
			++currSym;
			++count;
		}
		if (symCount)
			*symCount += count;
		return true;
	}